

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

void __thiscall cmDependsFortran::cmDependsFortran(cmDependsFortran *this)

{
  _Rb_tree_header *p_Var1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38);
  cmDepends::cmDepends(&this->super_cmDepends,(cmLocalGenerator *)0x0,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsFortran_00716df0;
  (this->SourceFile)._M_dataplus._M_p = (pointer)&(this->SourceFile).field_2;
  (this->SourceFile)._M_string_length = 0;
  (this->SourceFile).field_2._M_local_buf[0] = '\0';
  (this->CompilerId)._M_dataplus._M_p = (pointer)&(this->CompilerId).field_2;
  (this->CompilerId)._M_string_length = 0;
  (this->CompilerId).field_2._M_local_buf[0] = '\0';
  (this->SModSep)._M_dataplus._M_p = (pointer)&(this->SModSep).field_2;
  (this->SModSep)._M_string_length = 0;
  (this->SModSep).field_2._M_local_buf[0] = '\0';
  (this->SModExt)._M_dataplus._M_p = (pointer)&(this->SModExt).field_2;
  (this->SModExt)._M_string_length = 0;
  (this->SModExt).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Internal = (cmDependsFortranInternals *)0x0;
  return;
}

Assistant:

cmDependsFortran::cmDependsFortran() = default;